

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  int iVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  void *__ptr;
  int in_ECX;
  undefined1 *puVar7;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  int blocklen_1;
  uint s2;
  uint s1;
  int blocklen;
  int d_1;
  int e;
  int d;
  int n;
  uchar **hlist;
  uchar *bestloc;
  int best;
  int h;
  uchar ***hash_table;
  uchar *out;
  int bitcount;
  int j;
  int i;
  uint bitbuf;
  uint *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff78;
  int iVar8;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint local_78;
  int local_74;
  long local_58;
  uint local_50;
  uchar *local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_24;
  uchar *local_8;
  
  __ptr = malloc(0x20000);
  if (__ptr == (void *)0x0) {
    local_8 = (uchar *)0x0;
  }
  else {
    local_24 = in_ECX;
    if (in_ECX < 5) {
      local_24 = 5;
    }
    stbiw__sbgrowf((void **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    puVar7 = (undefined1 *)(long)iRamfffffffffffffffc;
    iRamfffffffffffffffc = iRamfffffffffffffffc + 1;
    *puVar7 = 0x78;
    stbiw__sbgrowf((void **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    puVar7 = (undefined1 *)(long)iRamfffffffffffffffc;
    iRamfffffffffffffffc = iRamfffffffffffffffc + 1;
    *puVar7 = 0x5e;
    stbiw__zlib_flushf((uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58,(int *)0x4272b5);
    local_34 = 3;
    stbiw__zlib_flushf((uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58,(int *)0x4272f5);
    for (local_2c = 0; local_2c < 0x4000; local_2c = local_2c + 1) {
      *(undefined8 *)((long)__ptr + (long)local_2c * 8) = 0;
    }
    local_2c = 0;
    while (local_2c < in_ESI + -3) {
      uVar5 = stbiw__zhash((uchar *)(in_RDI + local_2c));
      uVar5 = uVar5 & 0x3fff;
      local_50 = 3;
      local_58 = 0;
      lVar2 = *(long *)((long)__ptr + (long)(int)uVar5 * 8);
      if (lVar2 == 0) {
        iVar8 = 0;
      }
      else {
        iVar8 = *(int *)(lVar2 + -4);
      }
      in_stack_ffffffffffffff7c = iVar8;
      for (local_30 = 0; local_30 < iVar8; local_30 = local_30 + 1) {
        if (((long)(local_2c + -0x8000) < *(long *)(lVar2 + (long)local_30 * 8) - in_RDI) &&
           (uVar6 = stbiw__zlib_countm(*(uchar **)(lVar2 + (long)local_30 * 8),
                                       (uchar *)(in_RDI + local_2c),in_ESI - local_2c),
           (int)local_50 <= (int)uVar6)) {
          local_58 = *(long *)(lVar2 + (long)local_30 * 8);
          local_50 = uVar6;
        }
      }
      if ((*(long *)((long)__ptr + (long)(int)uVar5 * 8) != 0) &&
         (*(int *)(*(long *)((long)__ptr + (long)(int)uVar5 * 8) + -4) == local_24 * 2)) {
        memmove(*(void **)((long)__ptr + (long)(int)uVar5 * 8),
                (void *)(*(long *)((long)__ptr + (long)(int)uVar5 * 8) + (long)local_24 * 8),
                (long)local_24 << 3);
        *(int *)(*(long *)((long)__ptr + (long)(int)uVar5 * 8) + -4) = local_24;
      }
      if ((*(long *)((long)__ptr + (long)(int)uVar5 * 8) == 0) ||
         (*(int *)(*(long *)((long)__ptr + (long)(int)uVar5 * 8) + -8) <=
          *(int *)(*(long *)((long)__ptr + (long)(int)uVar5 * 8) + -4) + 1)) {
        stbiw__sbgrowf((void **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      }
      lVar2 = *(long *)((long)__ptr + (long)(int)uVar5 * 8);
      lVar3 = *(long *)((long)__ptr + (long)(int)uVar5 * 8);
      iVar8 = *(int *)(lVar3 + -4);
      *(int *)(lVar3 + -4) = iVar8 + 1;
      *(long *)(lVar2 + (long)iVar8 * 8) = in_RDI + local_2c;
      if (local_58 != 0) {
        uVar5 = stbiw__zhash((uchar *)(in_RDI + local_2c + 1));
        lVar2 = *(long *)((long)__ptr + (long)(int)(uVar5 & 0x3fff) * 8);
        if (lVar2 == 0) {
          iVar8 = 0;
        }
        else {
          iVar8 = *(int *)(lVar2 + -4);
        }
        in_stack_ffffffffffffff78 = iVar8;
        for (local_30 = 0; local_30 < iVar8; local_30 = local_30 + 1) {
          if (((long)(local_2c + -0x7fff) < *(long *)(lVar2 + (long)local_30 * 8) - in_RDI) &&
             (uVar5 = stbiw__zlib_countm(*(uchar **)(lVar2 + (long)local_30 * 8),
                                         (uchar *)(in_RDI + local_2c + 1),(in_ESI - local_2c) + -1),
             (int)local_50 < (int)uVar5)) {
            local_58 = 0;
            break;
          }
        }
      }
      if (local_58 == 0) {
        if (*(byte *)(in_RDI + local_2c) < 0x90) {
          stbiw__zlib_bitrev(*(byte *)(in_RDI + local_2c) + 0x30,8);
          local_34 = local_34 + 8;
          stbiw__zlib_flushf((uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff58,(int *)0x427a8b);
        }
        else {
          stbiw__zlib_bitrev(*(byte *)(in_RDI + local_2c) + 0x100,9);
          local_34 = local_34 + 9;
          stbiw__zlib_flushf((uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff58,(int *)0x427aef);
        }
        local_2c = local_2c + 1;
      }
      else {
        local_30 = 0;
        while ((int)(stbi_zlib_compress::lengthc[local_30 + 1] - 1) < (int)local_50) {
          local_30 = local_30 + 1;
        }
        if (local_30 + 0x101 < 0x90) {
          stbiw__zlib_bitrev(local_30 + 0x131,8);
          local_34 = local_34 + 8;
          stbiw__zlib_flushf((uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff58,(int *)0x427742);
        }
        else if (local_30 + 0x101 < 0x100) {
          stbiw__zlib_bitrev(local_30 + 0x201,9);
          local_34 = local_34 + 9;
          stbiw__zlib_flushf((uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff58,(int *)0x4277b2);
        }
        else if (local_30 + 0x101 < 0x118) {
          stbiw__zlib_bitrev(local_30 + 1,7);
          local_34 = local_34 + 7;
          stbiw__zlib_flushf((uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff58,(int *)0x427829);
        }
        else {
          stbiw__zlib_bitrev(local_30 + 0xa9,8);
          local_34 = local_34 + 8;
          stbiw__zlib_flushf((uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff58,(int *)0x427890);
        }
        if (stbi_zlib_compress::lengtheb[local_30] != '\0') {
          local_34 = (uint)stbi_zlib_compress::lengtheb[local_30] + local_34;
          stbiw__zlib_flushf((uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff58,(int *)0x427919);
        }
        local_30 = 0;
        while ((int)(stbi_zlib_compress::distc[local_30 + 1] - 1) <
               ((int)in_RDI + local_2c) - (int)local_58) {
          local_30 = local_30 + 1;
        }
        stbiw__zlib_bitrev(local_30,5);
        local_34 = local_34 + 5;
        stbiw__zlib_flushf((uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff58,(int *)0x427999);
        if (stbi_zlib_compress::disteb[local_30] != '\0') {
          local_34 = (uint)stbi_zlib_compress::disteb[local_30] + local_34;
          stbiw__zlib_flushf((uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff58,(int *)0x427a09);
        }
        local_2c = local_50 + local_2c;
      }
    }
    for (; local_2c < in_ESI; local_2c = local_2c + 1) {
      if (*(byte *)(in_RDI + local_2c) < 0x90) {
        stbiw__zlib_bitrev(*(byte *)(in_RDI + local_2c) + 0x30,8);
        local_34 = local_34 + 8;
        stbiw__zlib_flushf((uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff58,(int *)0x427b83);
      }
      else {
        stbiw__zlib_bitrev(*(byte *)(in_RDI + local_2c) + 0x100,9);
        local_34 = local_34 + 9;
        stbiw__zlib_flushf((uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff58,(int *)0x427be7);
      }
    }
    stbiw__zlib_bitrev(0,7);
    local_34 = local_34 + 7;
    local_40 = stbiw__zlib_flushf((uchar *)CONCAT44(in_stack_ffffffffffffff64,
                                                    in_stack_ffffffffffffff60),
                                  in_stack_ffffffffffffff58,(int *)0x427c3e);
    while (local_34 != 0) {
      local_34 = local_34 + 1;
      local_40 = stbiw__zlib_flushf((uchar *)CONCAT44(in_stack_ffffffffffffff64,
                                                      in_stack_ffffffffffffff60),
                                    in_stack_ffffffffffffff58,(int *)0x427c82);
    }
    for (local_2c = 0; local_2c < 0x4000; local_2c = local_2c + 1) {
      if (*(long *)((long)__ptr + (long)local_2c * 8) != 0) {
        free((void *)(*(long *)((long)__ptr + (long)local_2c * 8) + -8));
      }
    }
    free(__ptr);
    if (in_ESI + 2 + ((in_ESI + 0x7ffe) / 0x7fff) * 5 < *(int *)(local_40 + -4)) {
      local_40[-4] = '\x02';
      local_40[-3] = '\0';
      local_40[-2] = '\0';
      local_40[-1] = '\0';
      for (local_30 = 0; local_30 < in_ESI; local_30 = local_74 + local_30) {
        local_74 = in_ESI - local_30;
        if (0x7fff < local_74) {
          local_74 = 0x7fff;
        }
        if ((local_40 == (uchar *)0x0) || (*(int *)(local_40 + -8) <= *(int *)(local_40 + -4) + 1))
        {
          stbiw__sbgrowf((void **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
        }
        iVar8 = *(int *)(local_40 + -4);
        *(int *)(local_40 + -4) = iVar8 + 1;
        local_40[iVar8] = in_ESI - local_30 == local_74;
        if ((local_40 == (uchar *)0x0) || (*(int *)(local_40 + -8) <= *(int *)(local_40 + -4) + 1))
        {
          stbiw__sbgrowf((void **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
        }
        iVar8 = *(int *)(local_40 + -4);
        *(int *)(local_40 + -4) = iVar8 + 1;
        local_40[iVar8] = (byte)local_74;
        if ((local_40 == (uchar *)0x0) || (*(int *)(local_40 + -8) <= *(int *)(local_40 + -4) + 1))
        {
          stbiw__sbgrowf((void **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
        }
        bVar4 = (byte)((uint)local_74 >> 8);
        iVar8 = *(int *)(local_40 + -4);
        *(int *)(local_40 + -4) = iVar8 + 1;
        local_40[iVar8] = bVar4;
        if ((local_40 == (uchar *)0x0) || (*(int *)(local_40 + -8) <= *(int *)(local_40 + -4) + 1))
        {
          stbiw__sbgrowf((void **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
        }
        iVar8 = *(int *)(local_40 + -4);
        *(int *)(local_40 + -4) = iVar8 + 1;
        local_40[iVar8] = (byte)local_74 ^ 0xff;
        if ((local_40 == (uchar *)0x0) || (*(int *)(local_40 + -8) <= *(int *)(local_40 + -4) + 1))
        {
          stbiw__sbgrowf((void **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
        }
        iVar8 = *(int *)(local_40 + -4);
        *(int *)(local_40 + -4) = iVar8 + 1;
        local_40[iVar8] = bVar4 ^ 0xff;
        memcpy(local_40 + *(int *)(local_40 + -4),(void *)(in_RDI + local_30),(long)local_74);
        *(int *)(local_40 + -4) = local_74 + *(int *)(local_40 + -4);
      }
    }
    local_78 = 1;
    uVar5 = 0;
    local_30 = 0;
    iVar8 = in_ESI % 0x15b0;
    while (local_30 < in_ESI) {
      for (local_2c = 0; local_2c < iVar8; local_2c = local_2c + 1) {
        local_78 = *(byte *)(in_RDI + (local_30 + local_2c)) + local_78;
        uVar5 = local_78 + uVar5;
      }
      local_78 = local_78 % 0xfff1;
      uVar5 = uVar5 % 0xfff1;
      local_30 = iVar8 + local_30;
      iVar8 = 0x15b0;
    }
    if ((local_40 == (uchar *)0x0) || (*(int *)(local_40 + -8) <= *(int *)(local_40 + -4) + 1)) {
      stbiw__sbgrowf((void **)CONCAT44(uVar5,iVar8),in_stack_ffffffffffffff7c,
                     in_stack_ffffffffffffff78);
    }
    iVar1 = *(int *)(local_40 + -4);
    *(int *)(local_40 + -4) = iVar1 + 1;
    local_40[iVar1] = (uchar)(uVar5 >> 8);
    if ((local_40 == (uchar *)0x0) || (*(int *)(local_40 + -8) <= *(int *)(local_40 + -4) + 1)) {
      stbiw__sbgrowf((void **)CONCAT44(uVar5,iVar8),in_stack_ffffffffffffff7c,
                     in_stack_ffffffffffffff78);
    }
    iVar1 = *(int *)(local_40 + -4);
    *(int *)(local_40 + -4) = iVar1 + 1;
    local_40[iVar1] = (uchar)uVar5;
    if ((local_40 == (uchar *)0x0) || (*(int *)(local_40 + -8) <= *(int *)(local_40 + -4) + 1)) {
      stbiw__sbgrowf((void **)CONCAT44(uVar5,iVar8),in_stack_ffffffffffffff7c,
                     in_stack_ffffffffffffff78);
    }
    iVar1 = *(int *)(local_40 + -4);
    *(int *)(local_40 + -4) = iVar1 + 1;
    local_40[iVar1] = (uchar)(local_78 >> 8);
    if ((local_40 == (uchar *)0x0) || (*(int *)(local_40 + -8) <= *(int *)(local_40 + -4) + 1)) {
      stbiw__sbgrowf((void **)CONCAT44(uVar5,iVar8),in_stack_ffffffffffffff7c,
                     in_stack_ffffffffffffff78);
    }
    iVar8 = *(int *)(local_40 + -4);
    *(int *)(local_40 + -4) = iVar8 + 1;
    local_40[iVar8] = (uchar)local_78;
    *in_RDX = *(int *)(local_40 + -4);
    memmove(local_40 + -8,local_40,(long)*in_RDX);
    local_8 = local_40 + -8;
  }
  return local_8;
}

Assistant:

STBIWDEF unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
#ifdef STBIW_ZLIB_COMPRESS
   // user provided a zlib compress implementation, use that
   return STBIW_ZLIB_COMPRESS(data, data_len, out_len, quality);
#else // use builtin
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char ***hash_table = (unsigned char***) STBIW_MALLOC(stbiw__ZHASH * sizeof(unsigned char**));
   if (hash_table == NULL)
      return NULL;
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) { best=d; bestloc=hlist[j]; }
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);
   STBIW_FREE(hash_table);

   // store uncompressed instead if compression was worse
   if (stbiw__sbn(out) > data_len + 2 + ((data_len+32766)/32767)*5) {
      stbiw__sbn(out) = 2;  // truncate to DEFLATE 32K window and FLEVEL = 1
      for (j = 0; j < data_len;) {
         int blocklen = data_len - j;
         if (blocklen > 32767) blocklen = 32767;
         stbiw__sbpush(out, data_len - j == blocklen); // BFINAL = ?, BTYPE = 0 -- no compression
         stbiw__sbpush(out, STBIW_UCHAR(blocklen)); // LEN
         stbiw__sbpush(out, STBIW_UCHAR(blocklen >> 8));
         stbiw__sbpush(out, STBIW_UCHAR(~blocklen)); // NLEN
         stbiw__sbpush(out, STBIW_UCHAR(~blocklen >> 8));
         memcpy(out+stbiw__sbn(out), data+j, blocklen);
         stbiw__sbn(out) += blocklen;
         j += blocklen;
      }
   }

   {
      // compute adler32 on input
      unsigned int s1=1, s2=0;
      int blocklen = (int) (data_len % 5552);
      j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) { s1 += data[j+i]; s2 += s1; }
         s1 %= 65521; s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, STBIW_UCHAR(s2 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s2));
      stbiw__sbpush(out, STBIW_UCHAR(s1 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s1));
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
#endif // STBIW_ZLIB_COMPRESS
}